

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

QByteArray * cleaned(QByteArray *__return_storage_ptr__,QByteArray *input)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QByteArray::resize(__return_storage_ptr__,(input->d).size);
  pcVar8 = (input->d).ptr;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = &QByteArray::_empty;
  }
  pcVar7 = pcVar8 + (input->d).size;
  pcVar2 = QByteArray::data(__return_storage_ptr__);
  iVar3 = 0;
LAB_00133f09:
  do {
    if (pcVar8 == pcVar7) {
      pcVar8 = (__return_storage_ptr__->d).ptr;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = &QByteArray::_empty;
      }
      QByteArray::resize(__return_storage_ptr__,(long)pcVar2 - (long)pcVar8);
      return __return_storage_ptr__;
    }
    do {
      pcVar9 = pcVar8;
      pcVar5 = pcVar9 + 1;
      cVar4 = *pcVar9;
      if (pcVar9 == pcVar7) {
        if (cVar4 != '#') goto joined_r0x00133f53;
        goto LAB_00133f65;
      }
      pcVar8 = pcVar5;
    } while ((cVar4 == '\t') || (cVar4 == ' '));
    if (cVar4 == '#') {
LAB_00133f65:
      *pcVar2 = '#';
      pcVar2 = pcVar2 + 1;
      do {
        pcVar9 = pcVar9 + 1;
        pcVar8 = pcVar9;
        if (pcVar9 == pcVar7) break;
      } while ((*pcVar9 == ' ') || (*pcVar9 == '\t'));
    }
    else {
joined_r0x00133f53:
      pcVar8 = pcVar9;
      if ((cVar4 == '%') && (pcVar9 = pcVar5, *pcVar5 == ':')) goto LAB_00133f65;
    }
LAB_00133f8e:
    if (pcVar8 != pcVar7) {
      cVar4 = *pcVar8;
      if (cVar4 == '\\') {
        cVar1 = pcVar8[1];
        pcVar9 = pcVar8;
        if (cVar1 == '\r') {
          pcVar9 = pcVar8 + 1;
        }
        if (pcVar9 == pcVar7) {
          pcVar8 = pcVar9;
          cVar4 = '\\';
          if (cVar1 == '\r') {
            cVar4 = '\r';
          }
          goto LAB_00134026;
        }
        if (pcVar9[1] != '\n' && cVar1 != '\r') {
          cVar4 = '\\';
          goto LAB_00134026;
        }
        pcVar5 = pcVar9 + 1;
        pcVar8 = pcVar5;
        if (pcVar9[1] != '\r') {
          pcVar8 = pcVar9 + 2;
        }
        iVar3 = iVar3 + 1;
        if (pcVar5 == pcVar7) {
          pcVar8 = pcVar5;
        }
        goto LAB_00133f8e;
      }
      if (cVar4 == '\r') {
        cVar4 = (pcVar8[1] != '\n') * '\x03' + '\n';
        if (pcVar8[1] == '\n') {
          pcVar8 = pcVar8 + 1;
        }
      }
LAB_00134026:
      if (pcVar8 == pcVar7) goto LAB_00133f09;
      if (cVar4 == '\r') {
        cVar4 = '\n';
      }
      *pcVar2 = cVar4;
      if (*pcVar8 != '\n') {
        pcVar2 = pcVar2 + 1;
        pcVar8 = pcVar8 + 1;
        goto LAB_00133f8e;
      }
      for (lVar6 = 1; (int)lVar6 - iVar3 != 1; lVar6 = lVar6 + 1) {
        pcVar2[lVar6] = '\n';
      }
      pcVar8 = pcVar8 + 1;
      pcVar2 = pcVar2 + lVar6;
      iVar3 = 0;
    }
  } while( true );
}

Assistant:

static QByteArray cleaned(const QByteArray &input)
{
    QByteArray result;
    result.resize(input.size());
    const char *data = input.constData();
    const char *end = input.constData() + input.size();
    char *output = result.data();

    int newlines = 0;
    while (data != end) {
        while (data != end && is_space(*data))
            ++data;
        bool takeLine = (*data == '#');
        if (*data == '%' && *(data+1) == ':') {
            takeLine = true;
            ++data;
        }
        if (takeLine) {
            *output = '#';
            ++output;
            do ++data; while (data != end && is_space(*data));
        }
        while (data != end) {
            // handle \\\n, \\\r\n and \\\r
            if (*data == '\\') {
                if (*(data + 1) == '\r') {
                    ++data;
                }
                if (data != end && (*(data + 1) == '\n' || (*data) == '\r')) {
                    ++newlines;
                    data += 1;
                    if (data != end && *data != '\r')
                        data += 1;
                    continue;
                }
            } else if (*data == '\r' && *(data + 1) == '\n') { // reduce \r\n to \n
                ++data;
            }
            if (data == end)
                break;

            char ch = *data;
            if (ch == '\r') // os9: replace \r with \n
                ch = '\n';
            *output = ch;
            ++output;

            if (*data == '\n') {
                // output additional newlines to keep the correct line-numbering
                // for the lines following the backslash-newline sequence(s)
                while (newlines) {
                    *output = '\n';
                    ++output;
                    --newlines;
                }
                ++data;
                break;
            }
            ++data;
        }
    }
    result.resize(output - result.constData());
    return result;
}